

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::BuildResult(Clipper *this,Polygons *polys)

{
  size_type sVar1;
  Polygon *pPVar2;
  reference ppOVar3;
  reference this_00;
  OutPt *local_38;
  OutPt *p;
  Polygon *pg;
  size_type i;
  int k;
  Polygons *polys_local;
  Clipper *this_local;
  
  i._4_4_ = 0;
  sVar1 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                    (&this->m_PolyOuts);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(polys,sVar1);
  for (pg = (Polygon *)0x0;
      pPVar2 = (Polygon *)
               std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                         (&this->m_PolyOuts), pg < pPVar2;
      pg = (Polygon *)
           ((long)&(pg->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start + 1)) {
    ppOVar3 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        (&this->m_PolyOuts,(size_type)pg);
    if ((*ppOVar3)->pts != (OutPt *)0x0) {
      this_00 = std::
                vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ::operator[](polys,(long)i._4_4_);
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::clear(this_00);
      ppOVar3 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                          (&this->m_PolyOuts,(size_type)pg);
      local_38 = (*ppOVar3)->pts;
      do {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::push_back
                  (this_00,&local_38->pt);
        local_38 = local_38->next;
        ppOVar3 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::
                  operator[](&this->m_PolyOuts,(size_type)pg);
      } while (local_38 != (*ppOVar3)->pts);
      sVar1 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::size
                        (this_00);
      if (sVar1 < 3) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::clear(this_00);
      }
      else {
        i._4_4_ = i._4_4_ + 1;
      }
    }
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(polys,(long)i._4_4_);
  return;
}

Assistant:

void Clipper::BuildResult(Polygons &polys)
{
  int k = 0;
  polys.resize(m_PolyOuts.size());
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    if (m_PolyOuts[i]->pts)
    {
      Polygon* pg = &polys[k];
      pg->clear();
      OutPt* p = m_PolyOuts[i]->pts;
      do
      {
        pg->push_back(p->pt);
        p = p->next;
      } while (p != m_PolyOuts[i]->pts);
      //make sure each polygon has at least 3 vertices ...
      if (pg->size() < 3) pg->clear(); else k++;
    }
  }
  polys.resize(k);
}